

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

uint32_t kratos::num_size_decrease(Var *var)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  bVar6 = var->type_ == Slice;
  iVar3 = 0;
  do {
    iVar5 = iVar3;
    if (!bVar6) {
      iVar4 = 0;
      break;
    }
    pvVar2 = &var->size_;
    pvVar1 = &var->size_;
    var = (Var *)var[1].super_IRNode._vptr_IRNode;
    iVar4 = (int)((ulong)((long)(var->size_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(var->size_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2) -
            (int)((ulong)((long)(pvVar2->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar1->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
    bVar6 = true;
    iVar3 = iVar5 + iVar4;
  } while (var->type_ == Slice);
  return iVar4 + iVar5;
}

Assistant:

uint32_t num_size_decrease(Var *var) {
    if (var->type() == VarType::Slice) {
        auto *slice = reinterpret_cast<VarSlice *>(var);
        auto *parent = slice->parent_var;
        auto diff = parent->size().size() - slice->size().size();
        if (parent->type() == VarType::Slice) {
            return diff + num_size_decrease(reinterpret_cast<VarSlice *>(parent));
        } else {
            // base case 1
            return diff;
        }
    }
    // base case 0
    return 0;
}